

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hulog.cpp
# Opt level: O2

void log_summary(bool ondemand)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  pid_t pVar3;
  bool bVar4;
  FILE *__stream;
  iterator iVar5;
  mapped_type *__dest;
  _Base_ptr p_Var6;
  long lVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  reverse_iterator it;
  long lVar10;
  long lVar11;
  multiset<hu_allocinfo_s,_size_compare,_std::allocator<hu_allocinfo_s>_> allocations_by_size;
  map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
  allocations_by_callstack;
  
  if ((hu_log_file != (char *)0x0) && (__stream = fopen(hu_log_file,"a"), __stream != (FILE *)0x0))
  {
    p_Var2 = &allocations_by_callstack._M_t._M_impl.super__Rb_tree_header;
    allocations_by_callstack._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    allocations_by_callstack._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    allocations_by_callstack._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar10 = 0;
    lVar11 = 0;
    p_Var6 = (allocations->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    allocations_by_callstack._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var2->_M_header;
    allocations_by_callstack._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var2->_M_header;
    for (; (_Rb_tree_header *)p_Var6 != &(allocations->_M_t)._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      allocations_by_size._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      allocations_by_size._M_t._M_impl._0_8_ = 0;
      allocations_by_size._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      allocations_by_size._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      std::vector<void*,std::allocator<void*>>::_M_assign_aux<void**>
                ((vector<void*,std::allocator<void*>> *)&allocations_by_size,&p_Var6[1]._M_right,
                 &p_Var6[1]._M_right + *(int *)&p_Var6[6]._M_right);
      iVar5 = std::
              _Rb_tree<std::vector<void_*,_std::allocator<void_*>_>,_std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>,_std::_Select1st<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
              ::find(&allocations_by_callstack._M_t,(key_type *)&allocations_by_size);
      if ((_Rb_tree_header *)iVar5._M_node == p_Var2) {
        __dest = std::
                 map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
                 ::operator[]((map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
                               *)&allocations_by_callstack._M_t,(key_type *)&allocations_by_size);
        memcpy(__dest,&p_Var6[1]._M_parent,0x160);
        p_Var9 = p_Var6[1]._M_left;
      }
      else {
        piVar1 = (int *)((long)&iVar5._M_node[0xc]._M_left + 4);
        *piVar1 = *piVar1 + 1;
        p_Var9 = p_Var6[1]._M_left;
        *(long *)(iVar5._M_node + 2) = (long)&p_Var9->_M_color + *(long *)(iVar5._M_node + 2);
      }
      lVar10 = (long)&p_Var9->_M_color + lVar10;
      lVar11 = lVar11 + 1;
      std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                ((_Vector_base<void_*,_std::allocator<void_*>_> *)&allocations_by_size);
    }
    p_Var8 = &allocations_by_size._M_t._M_impl.super__Rb_tree_header._M_header;
    allocations_by_size._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         allocations_by_size._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
    ;
    allocations_by_size._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    allocations_by_size._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    allocations_by_size._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var8;
    allocations_by_size._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var8;
    for (p_Var6 = allocations_by_callstack._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var2; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      std::
      _Rb_tree<hu_allocinfo_s,hu_allocinfo_s,std::_Identity<hu_allocinfo_s>,size_compare,std::allocator<hu_allocinfo_s>>
      ::_M_insert_equal<hu_allocinfo_s_const&>
                ((_Rb_tree<hu_allocinfo_s,hu_allocinfo_s,std::_Identity<hu_allocinfo_s>,size_compare,std::allocator<hu_allocinfo_s>>
                  *)&allocations_by_size,(hu_allocinfo_s *)&p_Var6[1]._M_right);
    }
    if (ondemand) {
      fprintf(__stream,"==%d== ON DEMAND REPORT\n",(ulong)(uint)pid);
    }
    fprintf(__stream,"==%d== HEAP SUMMARY:\n",(ulong)(uint)pid);
    fprintf(__stream,"==%d==     in use at exit: %llu bytes in %llu blocks\n",(ulong)(uint)pid,
            lVar10,lVar11);
    fprintf(__stream,"==%d==   total heap usage: %llu allocs, %llu frees, %llu bytes allocated\n",
            (ulong)(uint)pid,allocinfo_total_allocs,allocinfo_total_frees,
            allocinfo_total_alloc_bytes);
    fprintf(__stream,"==%d==    peak heap usage: %llu bytes allocated\n",(ulong)(uint)pid,
            allocinfo_peak_alloc_bytes);
    fprintf(__stream,"==%d== \n",(ulong)(uint)pid);
    if (hu_leak == true) {
      while ((p_Var8 != allocations_by_size._M_t._M_impl.super__Rb_tree_header._M_header._M_left &&
             (lVar7 = std::_Rb_tree_decrement(p_Var8), hu_log_minleak <= *(ulong *)(lVar7 + 0x28))))
      {
        bVar4 = log_is_valid_callstack(*(int *)(lVar7 + 0xd0),(void **)(lVar7 + 0x30),true);
        pVar3 = pid;
        if (bVar4) {
          lVar7 = std::_Rb_tree_decrement(p_Var8);
          fprintf(__stream,"==%d== %zu bytes in %d block(s) are lost, originally allocated at:\n",
                  (ulong)(uint)pVar3,*(undefined8 *)(lVar7 + 0x28),(ulong)*(uint *)(lVar7 + 0x17c));
          lVar7 = std::_Rb_tree_decrement(p_Var8);
          log_print_callstack((FILE *)__stream,*(int *)(lVar7 + 0xd0),(void **)(lVar7 + 0x30));
          fprintf(__stream,"==%d== \n",(ulong)(uint)pid);
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var8);
      }
    }
    fprintf(__stream,"==%d== LEAK SUMMARY:\n",(ulong)(uint)pid);
    fprintf(__stream,"==%d==    definitely lost: %llu bytes in %llu blocks\n",(ulong)(uint)pid,
            lVar10,lVar11);
    fprintf(__stream,"==%d== \n",(ulong)(uint)pid);
    fclose(__stream);
    std::
    _Rb_tree<hu_allocinfo_s,_hu_allocinfo_s,_std::_Identity<hu_allocinfo_s>,_size_compare,_std::allocator<hu_allocinfo_s>_>
    ::~_Rb_tree(&allocations_by_size._M_t);
    std::
    _Rb_tree<std::vector<void_*,_std::allocator<void_*>_>,_std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>,_std::_Select1st<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
    ::~_Rb_tree(&allocations_by_callstack._M_t);
  }
  return;
}

Assistant:

void log_summary(bool ondemand)
{
  FILE *f = NULL;
  if (hu_log_file)
  {
    f = fopen(hu_log_file, "a");
  }

  if (!f)
  {
    return;
  }

  unsigned long long leak_total_bytes = 0;
  unsigned long long leak_total_blocks = 0;

  /* Group results by callstack */
  std::map<std::vector<void*>, hu_allocinfo_t> allocations_by_callstack;
  for (auto it = allocations->begin(); it != allocations->end(); ++it)
  {
    std::vector<void*> callstack;
    callstack.assign(it->second.callstack, it->second.callstack + it->second.callstack_depth);

    auto callstack_it = allocations_by_callstack.find(callstack);
    if (callstack_it != allocations_by_callstack.end())
    {
      callstack_it->second.count += 1;
      callstack_it->second.size += it->second.size;
    }
    else
    {
      allocations_by_callstack[callstack] = it->second;
    }

    leak_total_bytes += it->second.size;
    leak_total_blocks += 1;
  }

  /* Sort results by total allocation size */
  std::multiset<hu_allocinfo_t, size_compare> allocations_by_size;
  for (auto it = allocations_by_callstack.begin(); it != allocations_by_callstack.end(); ++it)
  {
      allocations_by_size.insert(it->second);
  }

  /* Indicate in case an on-demand report */
  if (ondemand)
  {
    fprintf(f, "==%d== ON DEMAND REPORT\n", pid);
  }

  /* Output heap summary */
  fprintf(f, "==%d== HEAP SUMMARY:\n", pid);
  fprintf(f, "==%d==     in use at exit: %llu bytes in %llu blocks\n",
          pid, leak_total_bytes, leak_total_blocks);
  fprintf(f, "==%d==   total heap usage: %llu allocs, %llu frees, %llu bytes allocated\n",
          pid, allocinfo_total_allocs, allocinfo_total_frees, allocinfo_total_alloc_bytes);
  fprintf(f, "==%d==    peak heap usage: %llu bytes allocated\n",
          pid, allocinfo_peak_alloc_bytes);
  fprintf(f, "==%d== \n", pid);

  /* Output leak details */
  if (hu_leak)
  {
    for (auto it = allocations_by_size.rbegin(); (it != allocations_by_size.rend()) && (it->size >= hu_log_minleak); ++it)
    {
      if (log_is_valid_callstack(it->callstack_depth, it->callstack, true))
      {
        fprintf(f, "==%d== %zu bytes in %d block(s) are lost, originally allocated at:\n", pid, it->size, it->count);

        log_print_callstack(f, it->callstack_depth, it->callstack);
    
        fprintf(f, "==%d== \n", pid);
      }
    }
  }
  
  /* Output leak summary */
  fprintf(f, "==%d== LEAK SUMMARY:\n", pid);
  fprintf(f, "==%d==    definitely lost: %llu bytes in %llu blocks\n", pid,
         leak_total_bytes, leak_total_blocks);
  fprintf(f, "==%d== \n", pid);

  fclose(f);
}